

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_input_has_mouse_click_down_in_rect(nk_input *i,nk_buttons id,nk_rect b,nk_bool down)

{
  nk_rect b_00;
  nk_bool nVar1;
  int in_EDX;
  nk_buttons in_ESI;
  nk_input *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  nk_mouse_button *btn;
  bool local_31;
  uint local_4;
  
  if (in_RDI == (nk_input *)0x0) {
    local_4 = 0;
  }
  else {
    b_00._8_8_ = in_XMM1_Qa;
    b_00._0_8_ = in_XMM0_Qa;
    nVar1 = nk_input_has_mouse_click_in_rect(in_RDI,in_ESI,b_00);
    local_31 = false;
    if (nVar1 != 0) {
      local_31 = (in_RDI->mouse).buttons[in_ESI].down == in_EDX;
    }
    local_4 = (uint)local_31;
  }
  return local_4;
}

Assistant:

NK_API nk_bool
nk_input_has_mouse_click_down_in_rect(const struct nk_input *i, enum nk_buttons id,
struct nk_rect b, nk_bool down)
{
const struct nk_mouse_button *btn;
if (!i) return nk_false;
btn = &i->mouse.buttons[id];
return nk_input_has_mouse_click_in_rect(i, id, b) && (btn->down == down);
}